

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conflict.cpp
# Opt level: O0

void __thiscall
SAT::getLearntClause
          (SAT *this,int nodeid,set<int,_std::less<int>,_std::allocator<int>_> *contributingNogoods)

{
  double dVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  Lit LVar5;
  int iVar6;
  Lit *pLVar7;
  float *pfVar8;
  int *piVar9;
  ulong uVar10;
  ostream *poVar11;
  char *pcVar12;
  LitFlags *this_00;
  anon_union_8_2_743a5d44_for_Reason_0 *paVar13;
  vec<char> *this_01;
  int in_ESI;
  long in_RDI;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar14;
  int x;
  Lit q;
  uint j;
  uint i_2;
  uint i_1;
  Clause *c;
  uint i;
  Reason last_reason;
  Clause *expl;
  vec<Lit> *ctrail;
  int clevel;
  int pathC;
  Lit p;
  int in_stack_fffffffffffffcac;
  SAT *in_stack_fffffffffffffcb0;
  SAT *in_stack_fffffffffffffcb8;
  vec<LitFlags> *in_stack_fffffffffffffcc0;
  ostream *in_stack_fffffffffffffcc8;
  string *in_stack_fffffffffffffcd0;
  SAT *in_stack_fffffffffffffcd8;
  vec<char> *in_stack_fffffffffffffce0;
  SAT *in_stack_fffffffffffffce8;
  SAT *in_stack_fffffffffffffcf0;
  ostream *in_stack_fffffffffffffcf8;
  string local_218 [32];
  int local_1f8;
  int local_1f4;
  uint local_1f0;
  int local_1ec;
  undefined1 local_1e8 [80];
  uint local_198;
  uint local_194;
  string local_190 [32];
  uint local_170;
  int local_16c;
  uint local_168;
  uint local_164;
  int local_160;
  uint local_15c;
  int local_158;
  int local_154;
  string local_150 [36];
  int local_12c;
  uint local_128;
  uint local_124;
  string local_120 [12];
  uint in_stack_fffffffffffffeec;
  string local_f0 [36];
  int local_cc;
  uint local_c8;
  uint local_c4;
  string local_c0 [36];
  int local_9c;
  _Base_ptr local_98;
  undefined1 local_90;
  Clause *local_88;
  int local_6c;
  string local_68 [36];
  uint local_44;
  anon_union_8_2_743a5d44_for_Reason_0 local_40;
  Clause *local_38;
  VarOrderLt local_30;
  uint local_24;
  int local_20;
  Lit local_1c [4];
  int local_c;
  
  local_1c[0].x = ::lit_Undef.x;
  local_20 = 0;
  local_c = in_ESI;
  local_24 = findConflictLevel(in_stack_fffffffffffffce8);
  local_30.activity =
       (vec<double> *)vec<vec<Lit>_>::operator[]((vec<vec<Lit>_> *)(in_RDI + 0xc0),local_24);
  local_38 = *(Clause **)(in_RDI + 0xf0);
  Reason::Reason((Reason *)&local_40,(Clause *)0x0);
  if ((so.debug & 1U) != 0) {
    std::operator<<((ostream *)&std::cerr,"trail of conflict level:");
    for (local_44 = 0; uVar4 = local_44, uVar3 = vec<Lit>::size((vec<Lit> *)local_30.activity),
        uVar4 < uVar3; local_44 = local_44 + 1) {
      std::operator<<((ostream *)&std::cerr," ");
      pLVar7 = vec<Lit>::operator[]((vec<Lit> *)local_30.activity,local_44);
      local_6c = pLVar7->x;
      toInt((Lit)local_6c);
      getLitString_abi_cxx11_(in_stack_fffffffffffffeec);
      std::operator<<((ostream *)&std::cerr,local_68);
      std::__cxx11::string::~string(local_68);
    }
    std::operator<<((ostream *)&std::cerr,"\n");
  }
  uVar4 = vec<Lit>::size((vec<Lit> *)local_30.activity);
  *(uint *)(in_RDI + 0xf8) = uVar4;
  vec<Lit>::clear((vec<Lit> *)in_stack_fffffffffffffcb0,
                  SUB41((uint)in_stack_fffffffffffffcac >> 0x18,0));
  vec<int>::clear((vec<int> *)in_stack_fffffffffffffcb0,
                  SUB41((uint)in_stack_fffffffffffffcac >> 0x18,0));
  vec<Lit>::push((vec<Lit> *)in_stack_fffffffffffffcb0);
  vec<int>::push((vec<int> *)in_stack_fffffffffffffcb0);
  do {
    local_88 = local_38;
    if (((ulong)*local_38 & 1) != 0) {
      dVar1 = *(double *)(in_RDI + 0x1a0);
      pfVar8 = Clause::activity(local_38);
      *pfVar8 = (float)dVar1 + *pfVar8;
      piVar9 = Clause::rawActivity(local_88);
      *piVar9 = *piVar9 + 1;
      Clause::clauseID(local_88);
      pVar14 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                         ((set<int,_std::less<int>,_std::allocator<int>_> *)
                          in_stack_fffffffffffffcd0,(value_type_conflict *)in_stack_fffffffffffffcc8
                         );
      local_98 = (_Base_ptr)pVar14.first._M_node;
      local_90 = pVar14.second;
    }
    if ((so.print_implications & 1U) != 0) {
      uVar10 = std::ofstream::is_open();
      if ((uVar10 & 1) == 0) {
        std::ofstream::open(implication_stream,0x2c2b3d);
      }
      std::ostream::operator<<(implication_stream,local_c);
      std::operator<<((ostream *)implication_stream,",");
      local_9c = ::lit_Undef.x;
      bVar2 = Lit::operator==(local_1c,::lit_Undef);
      if (bVar2) {
        std::operator<<((ostream *)implication_stream,"false");
      }
      else {
        local_c4 = local_1c[0].x;
        toInt(local_1c[0]);
        getLitString_abi_cxx11_(in_stack_fffffffffffffeec);
        std::operator<<((ostream *)implication_stream,local_c0);
        std::__cxx11::string::~string(local_c0);
      }
      std::operator<<((ostream *)implication_stream,",");
      local_cc = ::lit_Undef.x;
      bVar2 = Lit::operator==(local_1c,::lit_Undef);
      for (local_c8 = (uint)!bVar2; uVar4 = local_c8, uVar3 = Clause::size(local_88), uVar4 < uVar3;
          local_c8 = local_c8 + 1) {
        poVar11 = std::operator<<((ostream *)implication_stream," ");
        Clause::operator[]((Clause *)in_stack_fffffffffffffcb0,in_stack_fffffffffffffcac);
        LVar5 = operator~((Lit)0x2988d5);
        toInt(LVar5);
        getLitString_abi_cxx11_(in_stack_fffffffffffffeec);
        std::operator<<(poVar11,local_f0);
        std::__cxx11::string::~string(local_f0);
      }
      std::operator<<((ostream *)implication_stream,"\n");
    }
    if ((so.debug & 1U) != 0) {
      if (((ulong)*local_88 & 1) != 0) {
        poVar11 = std::operator<<((ostream *)&std::cerr,"L");
        piVar9 = Clause::clauseID(local_88);
        poVar11 = (ostream *)std::ostream::operator<<(poVar11,*piVar9);
        std::operator<<(poVar11," ");
      }
      std::operator<<((ostream *)&std::cerr,"\t");
      bVar2 = Lit::operator==(local_1c,::lit_Undef);
      if (bVar2) {
        std::operator<<((ostream *)&std::cerr,"false");
      }
      else {
        local_124 = local_1c[0].x;
        toInt(local_1c[0]);
        getLitString_abi_cxx11_(in_stack_fffffffffffffeec);
        std::operator<<((ostream *)&std::cerr,local_120);
        std::__cxx11::string::~string(local_120);
      }
      std::operator<<((ostream *)&std::cerr,"  <-");
      local_12c = ::lit_Undef.x;
      bVar2 = Lit::operator==(local_1c,::lit_Undef);
      for (local_128 = (uint)!bVar2; uVar4 = local_128, uVar3 = Clause::size(local_88),
          uVar4 < uVar3; local_128 = local_128 + 1) {
        poVar11 = std::operator<<((ostream *)&std::cerr,"  \t");
        pLVar7 = Clause::operator[]((Clause *)in_stack_fffffffffffffcb0,in_stack_fffffffffffffcac);
        local_158 = pLVar7->x;
        local_154 = (int)operator~((Lit)0x298b63);
        toInt((Lit)local_154);
        getLitString_abi_cxx11_(in_stack_fffffffffffffeec);
        std::operator<<(poVar11,local_150);
        std::__cxx11::string::~string(local_150);
      }
      std::operator<<((ostream *)&std::cerr,"\n");
    }
    local_160 = ::lit_Undef.x;
    bVar2 = Lit::operator==(local_1c,::lit_Undef);
    for (local_15c = (uint)!bVar2; uVar4 = local_15c, uVar3 = Clause::size(local_88), uVar4 < uVar3;
        local_15c = local_15c + 1) {
      pLVar7 = Clause::operator[]((Clause *)in_stack_fffffffffffffcb0,in_stack_fffffffffffffcac);
      local_16c = pLVar7->x;
      local_164 = local_16c;
      local_168 = ::var((Lit)local_16c);
      pcVar12 = vec<char>::operator[]((vec<char> *)(in_RDI + 0x120),local_168);
      if (*pcVar12 == '\0') {
        local_170 = local_164;
        varBumpActivity(in_stack_fffffffffffffcd8,
                        (Lit)(int)((ulong)in_stack_fffffffffffffce0 >> 0x20));
        pcVar12 = vec<char>::operator[]((vec<char> *)(in_RDI + 0x120),local_168);
        *pcVar12 = '\x01';
        bVar2 = isCurLevel(in_stack_fffffffffffffcb0,in_stack_fffffffffffffcac);
        if (bVar2) {
          local_20 = local_20 + 1;
          if ((so.debug & 1U) != 0) {
            local_198 = local_164;
            local_194 = (uint)operator~((Lit)0x298d64);
            toInt((Lit)local_194);
            getLitString_abi_cxx11_(in_stack_fffffffffffffeec);
            poVar11 = std::operator<<((ostream *)&std::cerr,local_190);
            poVar11 = std::operator<<(poVar11," is from current level; incremented pathC to ");
            poVar11 = (ostream *)std::ostream::operator<<(poVar11,local_20);
            std::operator<<(poVar11,"\n");
            std::__cxx11::string::~string(local_190);
          }
        }
        else {
          if ((so.debug & 1U) != 0) {
            poVar11 = std::operator<<((ostream *)&std::cerr,"added ");
            local_1e8._40_4_ = local_164;
            local_1e8._44_4_ = operator~((Lit)0x298e78);
            toInt((Lit)local_1e8._44_4_);
            getLitString_abi_cxx11_(in_stack_fffffffffffffeec);
            poVar11 = std::operator<<(poVar11,(string *)(local_1e8 + 0x30));
            std::operator<<(poVar11," to nogood\n");
            std::__cxx11::string::~string((string *)(local_1e8 + 0x30));
          }
          vec<Lit>::push((vec<Lit> *)in_stack_fffffffffffffcc0,(Lit *)in_stack_fffffffffffffcb8);
          local_1e8._36_4_ =
               getLevel(in_stack_fffffffffffffcb8,(int)((ulong)in_stack_fffffffffffffcb0 >> 0x20));
          vec<int>::push((vec<int> *)in_stack_fffffffffffffcc0,(int *)in_stack_fffffffffffffcb8);
        }
      }
      else if ((so.debug & 1U) != 0) {
        local_1f0 = local_164;
        local_1ec = (int)operator~((Lit)0x298f87);
        toInt((Lit)local_1ec);
        in_stack_fffffffffffffcf0 = (SAT *)local_1e8;
        getLitString_abi_cxx11_(in_stack_fffffffffffffeec);
        in_stack_fffffffffffffcf8 =
             std::operator<<((ostream *)&std::cerr,(string *)in_stack_fffffffffffffcf0);
        std::operator<<(in_stack_fffffffffffffcf8," already marked as seen; skipping explanation\n")
        ;
        std::__cxx11::string::~string((string *)local_1e8);
      }
    }
    while( true ) {
      do {
        this_01 = (vec<char> *)(in_RDI + 0x120);
        uVar4 = *(int *)(in_RDI + 0xf8) - 1;
        *(uint *)(in_RDI + 0xf8) = uVar4;
        pLVar7 = vec<Lit>::operator[]((vec<Lit> *)local_30.activity,uVar4);
        local_1f4 = pLVar7->x;
        uVar4 = ::var((Lit)local_1f4);
        pcVar12 = vec<char>::operator[](this_01,uVar4);
      } while (*pcVar12 == '\0');
      pLVar7 = vec<Lit>::operator[]((vec<Lit> *)local_30.activity,*(uint *)(in_RDI + 0xf8));
      local_1f8 = pLVar7->x;
      in_stack_fffffffffffffce0 = (vec<char> *)(in_RDI + 0x120);
      local_1c[0].x = local_1f8;
      uVar4 = ::var((Lit)local_1f8);
      pcVar12 = vec<char>::operator[](in_stack_fffffffffffffce0,uVar4);
      *pcVar12 = '\0';
      local_20 = local_20 + -1;
      if ((so.debug & 1U) != 0) {
        in_stack_fffffffffffffcc8 = std::operator<<((ostream *)&std::cerr,"selected ");
        toInt(local_1c[0]);
        in_stack_fffffffffffffcd0 = local_218;
        getLitString_abi_cxx11_(in_stack_fffffffffffffeec);
        in_stack_fffffffffffffcd8 =
             (SAT *)std::operator<<(in_stack_fffffffffffffcc8,in_stack_fffffffffffffcd0);
        std::operator<<((ostream *)in_stack_fffffffffffffcd8," as next literal to explain away\n");
        std::__cxx11::string::~string(local_218);
      }
      if (local_20 == 0) {
        in_stack_fffffffffffffcc0 = (vec<LitFlags> *)(in_RDI + 0x80);
        uVar4 = ::var(local_1c[0]);
        this_00 = vec<LitFlags>::operator[](in_stack_fffffffffffffcc0,uVar4);
        bVar2 = LitFlags::uipable(this_00);
        if (bVar2) {
          if ((so.debug & 1U) != 0) {
            std::operator<<((ostream *)&std::cerr,
                            "one only literal left at current level; finished\n");
          }
          LVar5 = operator~((Lit)0x29933f);
          pLVar7 = vec<Lit>::operator[]((vec<Lit> *)(in_RDI + 0x100),0);
          pLVar7->x = LVar5.x;
          iVar6 = decisionLevel((SAT *)0x299372);
          iVar6 = iVar6 + -1;
          piVar9 = vec<int>::operator[]((vec<int> *)(in_RDI + 0x110),0);
          *piVar9 = iVar6;
          return;
        }
      }
      in_stack_fffffffffffffcb8 = (SAT *)(in_RDI + 0x60);
      uVar4 = ::var(local_1c[0]);
      paVar13 = &vec<Reason>::operator[]((vec<Reason> *)in_stack_fffffffffffffcb8,uVar4)->field_0;
      bVar2 = Reason::operator==((Reason *)&local_40,(Reason)*paVar13);
      if (!bVar2) break;
      if ((so.debug & 1U) != 0) {
        std::operator<<((ostream *)&std::cerr,
                        "same reason as previously explained literal; skipping\n");
      }
    }
    in_stack_fffffffffffffcb0 = (SAT *)(in_RDI + 0x60);
    uVar4 = ::var(local_1c[0]);
    paVar13 = &vec<Reason>::operator[]((vec<Reason> *)in_stack_fffffffffffffcb0,uVar4)->field_0;
    local_40 = *paVar13;
    local_38 = getExpl(in_stack_fffffffffffffcf0,
                       (Lit)(int)((ulong)in_stack_fffffffffffffcf8 >> 0x20));
  } while( true );
}

Assistant:

void SAT::getLearntClause(int nodeid, std::set<int>& contributingNogoods) {
	Lit p = lit_Undef;
	int pathC = 0;
	const int clevel = findConflictLevel();
	vec<Lit>& ctrail = trail[clevel];
	Clause* expl = confl;
	Reason last_reason = nullptr;

	if (so.debug) {
		std::cerr << "trail of conflict level:";
		for (unsigned int i = 0; i < ctrail.size(); i++) {
			std::cerr << " ";
			std::cerr << getLitString(toInt(ctrail[i]));
		}
		std::cerr << "\n";
	}

	index = ctrail.size();
	out_learnt.clear();
	out_learnt_level.clear();
	out_learnt.push();  // (leave room for the asserting literal)
	out_learnt_level.push();

	while (true) {
		assert(expl != nullptr);  // (otherwise should be UIP)
		Clause& c = *expl;

		if (PRINT_ANALYSIS) {
			if (p != lit_Undef) {
				c[0] = p;
			}
			printClause(c);
		}

		if (c.learnt) {
			c.activity() += static_cast<float>(cla_inc);
			c.rawActivity() += 1;
			contributingNogoods.insert(c.clauseID());
		}

		/* if (so.debug) { */
		/*   if (p == lit_Undef) { */
		/*     std::cerr << "explaining away failure (" << decisionLevel() << ")\n"; */
		/*   } else { */
		/*     std::cerr << "explaining away " << getLitString(toInt(p)) << " (lit number " << toInt(p)
		 * << ", level " << getLevel(var(p)) << ")\n"; */
		/*   } */
		/*   std::cerr << "expl:"; */
		/*   for (int i = (p == lit_Undef ? 0 : 1) ; i < c.size() ; i++) */
		/*     std::cerr << " " << getLitString(toInt(~c[i])); */
		/*   std::cerr << "\n"; */
		/* } */

		if (so.print_implications) {
			if (!implication_stream.is_open()) {
				implication_stream.open("implication-log.csv");
			}

			implication_stream << nodeid;
			implication_stream << ",";
			if (p == lit_Undef) {
				implication_stream << "false";
			} else {
				implication_stream << getLitString(toInt(p));
			}
			implication_stream << ",";
			for (unsigned int i = (p == lit_Undef ? 0 : 1); i < c.size(); i++) {
				implication_stream << " " << getLitString(toInt(~c[i]));
			}
			implication_stream << "\n";
		}

		if (so.debug) {
			if (c.learnt) {
				std::cerr << "L" << c.clauseID() << " ";
			}
			std::cerr << "\t";

			if (p == lit_Undef) {
				std::cerr << "false";
			} else {
				std::cerr << getLitString(toInt(p));
			}
			std::cerr << "  <-";
			for (unsigned int i = (p == lit_Undef ? 0 : 1); i < c.size(); i++) {
				std::cerr << "  \t" << getLitString(toInt(~c[i]));
			}
			std::cerr << "\n";
		}

		for (unsigned int j = (p == lit_Undef) ? 0 : 1; j < c.size(); j++) {
			const Lit q = c[j];
			const int x = var(q);
			/* if (so.debug) { */
			/*   std::cerr << "adding " << getLitString(toInt(~q)) << " (lit number " << toInt(~q) << ",
			 * var " << x << ") from level " << getLevel(x); */
			/* } */
			if (seen[x] == 0) {
				varBumpActivity(q);
				seen[x] = 1;
				if (isCurLevel(x)) {
					pathC++;
					if (so.debug) {
						std::cerr << getLitString(toInt(~q)) << " is from current level; incremented pathC to "
											<< pathC << "\n";
					}
				} else {
					if (so.debug) {
						std::cerr << "added " << getLitString(toInt(~q)) << " to nogood\n";
					}
					out_learnt.push(q);
					out_learnt_level.push(getLevel(x));
				}
			} else {
				if (so.debug) {
					//                            std::cerr << " but already seen this variable";
					std::cerr << getLitString(toInt(~q)) << " already marked as seen; skipping explanation\n";
				}
			}
			/* if (so.debug) { */
			/*   std::cerr << ", pathC is now " << pathC << "\n"; */
			/* } */
		}

	FindNextExpl:

		assert(pathC > 0);

		// Select next clause to look at:
		while (seen[var(ctrail[--index])] == 0) {
			;
		}
		assert(index >= 0);
		p = ctrail[index];
		seen[var(p)] = 0;
		pathC--;

		if (so.debug) {
			std::cerr << "selected " << getLitString(toInt(p)) << " as next literal to explain away\n";
		}

		if (pathC == 0 && flags[var(p)].uipable()) {
			if (so.debug) {
				std::cerr << "one only literal left at current level; finished\n";
			}
			break;
		}

		// This appears to be just an optimisation.
		if (last_reason == reason[var(p)]) {
			if (so.debug) {
				std::cerr << "same reason as previously explained literal; skipping\n";
			}
			goto FindNextExpl;
		}
		last_reason = reason[var(p)];
		expl = getExpl(p);
	}

	out_learnt[0] = ~p;
	out_learnt_level[0] = decisionLevel() - 1;
}